

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_3::Vars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  FieldDescriptor FVar1;
  Options *options;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  allocator_type local_bb6;
  allocator<char> local_bb5;
  allocator<char> local_bb4;
  allocator<char> local_bb3;
  allocator<char> local_bb2;
  allocator<char> local_bb1;
  allocator<char> local_bb0;
  allocator<char> local_baf;
  allocator<char> local_bae;
  allocator<char> local_bad;
  allocator<char> local_bac;
  allocator<char> local_bab;
  allocator<char> local_baa;
  allocator<char> local_ba9;
  string lazy_var;
  string trivial_default;
  undefined1 local_b68 [32];
  undefined1 local_b48 [32];
  undefined1 local_b28 [32];
  char *local_b08;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  AlphaNum local_a60;
  string local_a30;
  string_view local_a10;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  unsigned_long local_940;
  string local_938;
  string local_918;
  string local_8f8;
  undefined1 local_8d8 [48];
  Sub local_8a8;
  string_view local_7f0;
  AlphaNum local_7c0;
  size_type local_790;
  pointer local_788;
  Sub local_760;
  string_view local_6a8 [11];
  string_view local_5f0 [11];
  string_view local_538 [11];
  Sub local_480;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  local_760.key_._0_16_ = absl::lts_20240722::NullSafeStringView("::");
  bVar4 = opts->opensource_runtime != false;
  local_8a8.key_._M_dataplus._M_p = (pointer)6;
  if (bVar4) {
    local_8a8.key_._M_dataplus._M_p = (pointer)0x10;
  }
  local_8a8.key_._M_string_length = 0x2ed1de;
  if (bVar4) {
    local_8a8.key_._M_string_length = 0x2ed1e5;
  }
  local_8d8._0_16_ =
       (undefined1  [16])
       absl::lts_20240722::NullSafeStringView("::internal::GetEmptyStringAlreadyInited()");
  options = (Options *)local_8d8;
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)&trivial_default,(AlphaNum *)&local_760,(AlphaNum *)&local_8a8);
  QualifiedClassName_abi_cxx11_
            ((string *)&local_a10,*(cpp **)(field + 0x20),(Descriptor *)opts,options);
  local_760.key_._M_string_length = local_a10._M_len;
  local_760.key_._M_dataplus._M_p = local_a10._M_str;
  local_8a8.key_._0_16_ = absl::lts_20240722::NullSafeStringView("::");
  MakeDefaultFieldName_abi_cxx11_((string *)&local_a60,(cpp *)field,local_8a8.key_._M_string_length)
  ;
  field_00 = (FieldDescriptor *)local_8d8;
  local_8d8._0_8_ = local_a60.piece_._M_str;
  local_8d8._8_8_ = local_a60.piece_._M_len;
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)&lazy_var,(AlphaNum *)&local_760,(AlphaNum *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a10);
  lVar3 = *(long *)(*(long *)(field + 0x50) + 8);
  FVar1 = field[2];
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"kDefault",&local_ba9);
  DefaultValue_abi_cxx11_(&local_918,(cpp *)opts,(Options *)field,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_760,&local_8f8,&local_918);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"kDefaultLen",&local_baa);
  local_940 = *(unsigned_long *)(*(long *)(field + 0x50) + 8);
  io::Printer::Sub::Sub<unsigned_long>((Sub *)local_6a8,&local_938,&local_940);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"default_variable_name",&local_bab);
  MakeDefaultName_abi_cxx11_(&local_980,(cpp *)field,field_01);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_5f0,&local_960,&local_980);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"default_variable_field",&local_bac);
  MakeDefaultFieldName_abi_cxx11_(&local_9c0,(cpp *)field,field_02);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_538,&local_9a0,&local_9c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"kDefaultStr",&local_bad);
  if (lVar3 == 0) {
    std::__cxx11::string::string((string *)local_b28,(string *)&trivial_default);
  }
  else {
    local_8d8._0_8_ = lazy_var._M_string_length;
    local_8d8._8_8_ = lazy_var._M_dataplus._M_p;
    local_a10 = absl::lts_20240722::NullSafeStringView(".get()");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b28,(AlphaNum *)local_8d8);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_480,&local_9e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a30,"kDefaultValue",&local_bae);
  if (lVar3 == 0) {
    local_a60.piece_ = absl::lts_20240722::NullSafeStringView("&");
    local_790 = trivial_default._M_string_length;
    local_788 = trivial_default._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b48,&local_a60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b48,"nullptr",&local_baf);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_3c8,&local_a30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80,"lazy_var",&local_bb0);
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_310,&local_a80,&lazy_var);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa0,"lazy_args",&local_bb1);
  if (lVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b68,"",&local_bb2);
  }
  else {
    local_7c0.piece_._M_len = lazy_var._M_string_length;
    local_7c0.piece_._M_str = lazy_var._M_dataplus._M_p;
    local_7f0 = absl::lts_20240722::NullSafeStringView(",");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b68,&local_7c0);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_8a8,&local_aa0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,",",&local_bb3);
  io::Printer::Sub::WithSuffix(&local_258,&local_8a8,&local_ac0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"byte",&local_bb4);
  pcVar2 = "char";
  if (FVar1 == (FieldDescriptor)0xc) {
    pcVar2 = "void";
  }
  io::Printer::Sub::Sub<char_const(&)[5]>(&local_1a0,&local_ae0,(char (*) [5])pcVar2);
  pcVar2 = "Set";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b00,"Set",&local_bb5);
  if (FVar1 == (FieldDescriptor)0xc) {
    pcVar2 = "SetBytes";
  }
  local_b08 = pcVar2;
  io::Printer::Sub::Sub<char_const*>(&local_e8,&local_b00,&local_b08);
  __l._M_len = 10;
  __l._M_array = &local_760;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_bb6);
  lVar3 = 0x678;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&((string_view *)&local_760)->_M_len + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_b00);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&local_ac0);
  io::Printer::Sub::~Sub(&local_8a8);
  std::__cxx11::string::~string((string *)local_b68);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)local_b48);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)local_b28);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_938);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&lazy_var);
  std::__cxx11::string::~string((string *)&trivial_default);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> Vars(const FieldDescriptor* field, const Options& options) {
  bool cold = ShouldSplit(field, options);
  return {
      {"Type", PrimitiveTypeName(options, field->cpp_type())},
      {"kDefault", DefaultValue(options, field)},
      {"_field_cached_byte_size_", MakeVarintCachedSizeFieldName(field, cold)},
  };
}